

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O3

void test_word_container<wchar_t,std::_List_iterator<wchar_t>>
               (_List_iterator<wchar_t> begin,_List_iterator<wchar_t> end,
               vector<int,_std::allocator<int>_> *ipos,vector<int,_std::allocator<int>_> *imasks,
               vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *ichunks,locale *l,boundary_type bt)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  pointer pbVar4;
  pointer pbVar5;
  int iVar6;
  pointer piVar7;
  ostream *poVar8;
  runtime_error *prVar9;
  ulong uVar10;
  long lVar11;
  int *__args;
  uint uVar12;
  _Self __tmp;
  _List_iterator<wchar_t> _Var13;
  ulong uVar14;
  bool bVar15;
  _List_iterator<wchar_t> ptr;
  bi_type bi;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  chunks;
  ti_type ti;
  vector<std::_List_iterator<wchar_t>,_std::allocator<std::_List_iterator<wchar_t>_>_> iters;
  vector<int,_std::allocator<int>_> masks;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bmasks;
  vector<int,_std::allocator<int>_> pos;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  fchunks;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> empty_chunk;
  undefined1 local_228 [16];
  mapping<std::_List_iterator<wchar_t>_> local_218;
  uint local_1f8;
  bool local_1f4;
  undefined1 local_1e8 [16];
  mapping<std::_List_iterator<wchar_t>_> local_1d8;
  uint local_1b8;
  bool local_1b4;
  undefined1 local_1b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  rule_type local_190;
  undefined1 local_18c;
  uint local_184;
  undefined1 local_180 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_170;
  uint local_160;
  undefined1 local_15c;
  base_iterator local_158;
  _List_iterator<wchar_t> local_150;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_148;
  string local_130;
  uint local_110;
  undefined1 local_10c;
  void *local_108;
  iterator iStack_100;
  _List_iterator<wchar_t> *local_f8;
  locale *local_f0;
  void *local_e8;
  iterator iStack_e0;
  int *local_d8;
  ulong local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  undefined1 local_b0 [8];
  void *local_a8;
  iterator iStack_a0;
  int *local_98;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_88;
  vector<int,_std::allocator<int>_> *local_68;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_60;
  vector<int,_std::allocator<int>_> *local_40;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *local_38;
  
  uVar14 = 3;
  local_158._M_node = end._M_node;
  local_150._M_node = begin._M_node;
  local_f0 = l;
  local_68 = ipos;
  local_40 = imasks;
  local_38 = ichunks;
  if (bt == word) {
    uVar14 = 0x1f;
  }
  do {
    _Var13._M_node = (_List_node_base *)&local_218;
    uVar12 = 0;
    if ((uVar14 & 1) != 0) {
      uVar12 = 0xf;
    }
    local_e8 = (void *)0x0;
    iStack_e0._M_current = (int *)0x0;
    local_d8 = (int *)0x0;
    local_98 = (int *)0x0;
    local_a8 = (void *)0x0;
    iStack_a0._M_current = (int *)0x0;
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = L'\0';
    local_148.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8 = (_List_iterator<wchar_t> *)0x0;
    local_108 = (void *)0x0;
    iStack_100._M_current = (_List_iterator<wchar_t> *)0x0;
    std::vector<std::_List_iterator<wchar_t>,std::allocator<std::_List_iterator<wchar_t>>>::
    _M_realloc_insert<std::_List_iterator<wchar_t>const&>
              ((vector<std::_List_iterator<wchar_t>,std::allocator<std::_List_iterator<wchar_t>>> *)
               &local_108,(iterator)0x0,&local_150);
    local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
    if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_c8,
                 (iterator)
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1e8);
    }
    else {
      *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar6 = (int)uVar14;
    local_184 = (iVar6 << 0x1b) >> 0x1f & 0xf0000U |
                (iVar6 << 0x1c) >> 0x1f & 0xf000U |
                (iVar6 << 0x1d) >> 0x1f & 0xf00U | (iVar6 << 0x1e) >> 0x1f & 0xf0U | uVar12;
    piVar7 = (imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    local_d0 = uVar14;
    if ((imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar7) {
      uVar14 = 0;
      do {
        if ((local_184 & piVar7[uVar14]) == 0) {
          std::__cxx11::wstring::_M_append
                    ((wchar_t *)&local_60,
                     (ulong)(ichunks->
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p);
        }
        else {
          if (iStack_e0._M_current == local_d8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_e8,iStack_e0,piVar7 + uVar14);
          }
          else {
            *iStack_e0._M_current = piVar7[uVar14];
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
          std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::push_back(&local_148,
                      (ichunks->
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar14);
          std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)local_1e8,&local_60,
                         (ichunks->
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar14);
          std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
          emplace_back<std::__cxx11::wstring>
                    ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
                     &local_88,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_1e8);
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._0_8_ != &local_1d8) {
            operator_delete((void *)local_1e8._0_8_);
          }
          local_60._M_string_length = 0;
          *local_60._M_dataplus._M_p = L'\0';
          __args = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar14;
          if (iStack_a0._M_current == local_98) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,__args);
          }
          else {
            *iStack_a0._M_current = *__args;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
        }
        piVar7 = (imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (((piVar7[uVar14] & local_184) != 0) ||
           (uVar10 = (long)(imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar7 >> 2,
           uVar10 - 1 == uVar14)) {
          iVar6 = (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar14];
          lVar11 = (long)iVar6;
          local_1e8._0_8_ = local_150._M_node;
          if (lVar11 < 1) {
            if (iVar6 != 0) {
              do {
                local_1e8._0_8_ =
                     (((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._0_8_)->index_).
                     super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0);
            }
          }
          else {
            do {
              local_1e8._0_8_ =
                   (((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._0_8_)->index_).
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
          if (iStack_100._M_current == local_f8) {
            std::vector<std::_List_iterator<wchar_t>,std::allocator<std::_List_iterator<wchar_t>>>::
            _M_realloc_insert<std::_List_iterator<wchar_t>const&>
                      ((vector<std::_List_iterator<wchar_t>,std::allocator<std::_List_iterator<wchar_t>>>
                        *)&local_108,iStack_100,(_List_iterator<wchar_t> *)local_1e8);
          }
          else {
            (iStack_100._M_current)->_M_node = (_List_node_base *)local_1e8._0_8_;
            iStack_100._M_current = iStack_100._M_current + 1;
          }
          piVar7 = (imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_228._0_4_ = piVar7[uVar14];
          if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_c8,
                       (iterator)
                       local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)local_228);
            piVar7 = (imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          else {
            *local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = piVar7[uVar14];
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar10 = (long)(imasks->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar7 >> 2;
        }
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (uVar14 < uVar10);
    }
    booster::locale::boundary::details::mapping<std::_List_iterator<wchar_t>_>::mapping
              ((mapping<std::_List_iterator<wchar_t>_> *)local_1b0,bt,
               (base_iterator)local_150._M_node,local_158,local_f0);
    local_190 = local_184;
    local_1e8._0_8_ = (_List_node_base *)0x0;
    local_1e8._8_8_ = (_List_node_base *)0x0;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d8.begin_._M_node = (_List_node_base *)0x0;
    local_1d8.end_._M_node._0_5_ = 0;
    local_1d8.end_._M_node._5_3_ = 0;
    local_18c = 0;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.begin_._M_node = (_List_node_base *)0x0;
    local_218.end_._M_node._0_5_ = SUB85((mapping<std::_List_iterator<wchar_t>_> *)local_1b0,0);
    local_218.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
    local_1f8 = local_184;
    local_1f4 = false;
    local_228._0_8_ = local_1a0._M_allocated_capacity;
    local_228._8_8_ = local_1a0._M_allocated_capacity;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_218.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
    local_1e8._0_8_ = local_228._0_8_;
    local_1e8._8_8_ = local_228._8_8_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1d8.begin_._M_node = local_218.begin_._M_node;
    local_1b8 = local_1f8;
    local_1b4 = local_1f4;
    local_1d8.end_._M_node._0_5_ = local_218.end_._M_node._0_5_;
    local_1d8.end_._M_node._5_3_ = local_218.end_._M_node._5_3_;
    if (((mapping<std::_List_iterator<wchar_t>_> *)
         CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_) !=
         (mapping<std::_List_iterator<wchar_t>_> *)local_1b0) ||
       (uVar12 = 0,
       local_218.begin_._M_node !=
       (_List_node_base *)
       ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi -
        (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                 *)local_1b0)->
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr >> 4))) {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                  ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
        uVar2 = local_228._0_8_;
        uVar14 = (ulong)uVar12;
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)
            local_148.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
            bVar15 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                            local_228._8_8_);
            bVar15 = iVar6 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((_List_node_base *)uVar2 != _Var13._M_node) {
          operator_delete((void *)uVar2);
        }
        if (!bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x67);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = _Var13._M_node;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1d8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x68);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule() == unsigned(masks[i])",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = _Var13._M_node;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
        uVar12 = uVar12 + 1;
      } while (((undefined1 *)CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) !=
                local_1b0) ||
              (local_1d8.begin_._M_node !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_1b0)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != (ulong)uVar12) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," chunks.size() == i",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar15 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar15) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_228);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    while( true ) {
      uVar12 = uVar12 - 1;
      local_218.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218.begin_._M_node = (_List_node_base *)0x0;
      local_218.end_._M_node._0_5_ = SUB85(local_1b0,0);
      local_218.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
      local_1f8 = local_190;
      local_1f4 = (bool)local_18c;
      local_228._0_8_ = local_1a0._M_allocated_capacity;
      local_228._8_8_ = local_1a0._M_allocated_capacity;
      local_218.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((ulong)local_218.index_.
                        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr & 0xffffffff00000000);
      booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
      increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
      if ((CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) ==
           CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_)) &&
         (local_1d8.begin_._M_node == local_218.begin_._M_node)) break;
      booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
      decrement((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
      test_counter = test_counter + 1;
      local_228._0_8_ = _Var13._M_node;
      std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
      uVar2 = local_228._0_8_;
      uVar14 = (ulong)uVar12;
      if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
          (mapping<std::_List_iterator<wchar_t>_> *)
          local_148.
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
          bVar15 = true;
        }
        else {
          iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                          local_148.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                          local_228._8_8_);
          bVar15 = iVar6 == 0;
        }
      }
      else {
        bVar15 = false;
      }
      if ((_List_node_base *)uVar2 != _Var13._M_node) {
        operator_delete((void *)uVar2);
      }
      if (!bVar15) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x73);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[--i]",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar15 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar15) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_228._0_8_ = _Var13._M_node;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar9,(string *)local_228);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if (local_1d8.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x74);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," p->rule() == unsigned(masks[i])",0x20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar15 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar15) goto LAB_0011c692;
      }
    }
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar15 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar15) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_228);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_1d8.begin_._M_node =
         (_List_node_base *)
         ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi -
          (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                   *)local_1b0)->
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr >> 4);
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&local_1d8.begin_._M_node[-1]._M_prev + 7);
    local_1e8._0_8_ = local_1a0._8_8_;
    local_1e8._8_8_ = local_1a0._8_8_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = L'\0';
    local_1d8.end_._M_node._0_5_ = SUB85(local_1b0,0);
    local_1d8.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
    local_1b8 = local_190;
    local_1b4 = (bool)local_18c;
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_148.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = 1;
      uVar14 = 0;
      do {
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        decrement((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
        pbVar5 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        test_counter = test_counter + 1;
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                  ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
        uVar2 = local_228._0_8_;
        uVar14 = (ulong)((int)((ulong)((long)pbVar5 - (long)pbVar4) >> 5) + ~(uint)uVar14);
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)
            local_148.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
            bVar15 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                            local_228._8_8_);
            bVar15 = iVar6 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((_List_node_base *)uVar2 != _Var13._M_node) {
          operator_delete((void *)uVar2);
        }
        if (!bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[index]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = _Var13._M_node;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1d8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule() == unsigned(masks[index])",0x24);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = _Var13._M_node;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        uVar14 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar14 < (ulong)((long)local_148.
                                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    test_counter = test_counter + 1;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.begin_._M_node = (_List_node_base *)0x0;
    local_218.end_._M_node._0_5_ = SUB85(local_1b0,0);
    local_218.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
    local_1f8 = local_190;
    local_1f4 = (bool)local_18c;
    local_228._0_8_ = local_1a0._M_allocated_capacity;
    local_228._8_8_ = local_1a0._M_allocated_capacity;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_218.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
    if ((CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) !=
         CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_)) ||
       (local_1d8.begin_._M_node != local_218.begin_._M_node)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," p==map.begin()",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar15 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar15) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_228);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_1e8._0_8_ = (_List_node_base *)0x0;
    local_1e8._8_8_ = (_List_node_base *)0x0;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d8.begin_._M_node = (_List_node_base *)0x0;
    local_1d8.end_._M_node._0_5_ = 0;
    local_1d8.end_._M_node._5_3_ = 0;
    local_18c = 1;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.begin_._M_node = (_List_node_base *)0x0;
    local_218.end_._M_node._0_5_ = SUB85(local_1b0,0);
    local_218.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
    local_1f8 = local_190;
    local_1f4 = true;
    local_228._0_8_ = local_1a0._M_allocated_capacity;
    local_228._8_8_ = local_1a0._M_allocated_capacity;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_218.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
    local_1e8._0_8_ = local_228._0_8_;
    local_1e8._8_8_ = local_228._8_8_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1d8.begin_._M_node = local_218.begin_._M_node;
    local_1b8 = local_1f8;
    local_1b4 = local_1f4;
    local_1d8.end_._M_node._0_5_ = local_218.end_._M_node._0_5_;
    local_1d8.end_._M_node._5_3_ = local_218.end_._M_node._5_3_;
    if (((undefined1 *)CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_) !=
         local_1b0) ||
       (uVar12 = 0,
       local_218.begin_._M_node !=
       (_List_node_base *)
       ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi -
        (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                 *)local_1b0)->
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr >> 4))) {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                  ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
        uVar2 = local_228._0_8_;
        uVar14 = (ulong)uVar12;
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)
            local_88.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
            bVar15 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                            local_88.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                            local_228._8_8_);
            bVar15 = iVar6 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((_List_node_base *)uVar2 != _Var13._M_node) {
          operator_delete((void *)uVar2);
        }
        if (!bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x85);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==fchunks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = _Var13._M_node;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1d8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x86);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule() == unsigned(masks[i])",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = _Var13._M_node;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
        uVar12 = uVar12 + 1;
      } while (((undefined1 *)CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) !=
                local_1b0) ||
              (local_1d8.begin_._M_node !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_1b0)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != (ulong)uVar12) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x89);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," chunks.size() == i",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar15 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar15) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_228);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    while( true ) {
      uVar12 = uVar12 - 1;
      local_218.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_218.begin_._M_node = (_List_node_base *)0x0;
      local_218.end_._M_node._0_5_ = SUB85(local_1b0,0);
      local_218.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
      local_1f8 = local_190;
      local_1f4 = (bool)local_18c;
      local_228._0_8_ = local_1a0._M_allocated_capacity;
      local_228._8_8_ = local_1a0._M_allocated_capacity;
      local_218.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((ulong)local_218.index_.
                        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr & 0xffffffff00000000);
      booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
      increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
      if ((CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) ==
           CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_)) &&
         (local_1d8.begin_._M_node == local_218.begin_._M_node)) break;
      booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
      decrement((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
      local_228._0_8_ = _Var13._M_node;
      std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
      uVar2 = local_228._0_8_;
      uVar14 = (ulong)uVar12;
      if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
          (mapping<std::_List_iterator<wchar_t>_> *)
          local_88.
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
          bVar15 = false;
        }
        else {
          iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                          local_88.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                          local_228._8_8_);
          bVar15 = iVar6 != 0;
        }
      }
      else {
        bVar15 = true;
      }
      if ((_List_node_base *)uVar2 != _Var13._M_node) {
        operator_delete((void *)uVar2);
      }
      if ((bVar15) &&
         (local_228._0_8_ = _Var13._M_node,
         std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                   ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_),
         (_List_node_base *)local_228._0_8_ != _Var13._M_node)) {
        operator_delete((void *)local_228._0_8_);
      }
      test_counter = test_counter + 1;
      local_228._0_8_ = _Var13._M_node;
      std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
      uVar2 = local_228._0_8_;
      if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
          (mapping<std::_List_iterator<wchar_t>_> *)
          local_88.
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
          bVar15 = true;
        }
        else {
          iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                          local_88.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                          local_228._8_8_);
          bVar15 = iVar6 == 0;
        }
      }
      else {
        bVar15 = false;
      }
      if ((_List_node_base *)uVar2 != _Var13._M_node) {
        operator_delete((void *)uVar2);
      }
      if (!bVar15) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x96);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==fchunks[--i]",0x17);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar15 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar15) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_228._0_8_ = _Var13._M_node;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar9,(string *)local_228);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if (local_1d8.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x97);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," p->rule() == unsigned(masks[i])",0x20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar15 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar15) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_228._0_8_ = _Var13._M_node;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar9,(string *)local_228);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar15 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar15) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_228);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_1d8.begin_._M_node =
         (_List_node_base *)
         ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi -
          (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                   *)local_1b0)->
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr >> 4);
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&local_1d8.begin_._M_node[-1]._M_prev + 7);
    local_1e8._0_8_ = local_1a0._8_8_;
    local_1e8._8_8_ = local_1a0._8_8_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = L'\0';
    local_1d8.end_._M_node._0_5_ = SUB85(local_1b0,0);
    local_1d8.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
    local_1b8 = local_190;
    local_1b4 = (bool)local_18c;
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_148.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar12 = 1;
      uVar14 = 0;
      do {
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        decrement((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
        pbVar5 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        test_counter = test_counter + 1;
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                  ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
        uVar2 = local_228._0_8_;
        uVar14 = (ulong)((int)((ulong)((long)pbVar5 - (long)pbVar4) >> 5) + ~(uint)uVar14);
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)
            local_88.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
            bVar15 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                            local_88.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                            local_228._8_8_);
            bVar15 = iVar6 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((_List_node_base *)uVar2 != _Var13._M_node) {
          operator_delete((void *)uVar2);
        }
        if (!bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->str()==fchunks[index]",0x19);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = _Var13._M_node;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1d8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9f);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule() == unsigned(masks[index])",0x24);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = _Var13._M_node;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        uVar14 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar14 < (ulong)((long)local_148.
                                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    test_counter = test_counter + 1;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.begin_._M_node = (_List_node_base *)0x0;
    local_218.end_._M_node._0_5_ = SUB85(local_1b0,0);
    local_218.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
    local_1f8 = local_190;
    local_1f4 = (bool)local_18c;
    local_228._0_8_ = local_1a0._M_allocated_capacity;
    local_228._8_8_ = local_1a0._M_allocated_capacity;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_218.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
    if ((CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) !=
         CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_)) ||
       (local_1d8.begin_._M_node != local_218.begin_._M_node)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," p==map.begin()",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar15 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar15) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_228._0_8_ = _Var13._M_node;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_228);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_18c = 0;
    if (local_150._M_node != local_158._M_node) {
      uVar12 = 0;
      local_b0 = (undefined1  [8])0x0;
      _Var13._M_node = local_150._M_node;
      do {
        local_1e8._0_8_ = (mapping<std::_List_iterator<wchar_t>_> *)0x0;
        local_1e8._8_8_ = (mapping<std::_List_iterator<wchar_t>_> *)0x0;
        local_1d8.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1d8.begin_._M_node = (_List_node_base *)0x0;
        local_1d8.end_._M_node._0_5_ = SUB85(local_1b0,0);
        local_1d8.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
        local_1b8 = local_190;
        local_1b4 = (bool)local_18c;
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        set((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8,
            (base_iterator)_Var13._M_node);
        uVar3 = local_1d8.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr._0_4_;
        uVar2 = local_1e8._0_8_;
        uVar10 = (ulong)local_b0 & 0xffffffff;
        uVar14 = (long)iStack_a0._M_current - (long)local_a8 >> 2;
        if (uVar10 < uVar14) {
          uVar10 = (ulong)((local_b0._0_4_ + 1) -
                          (uint)(uVar12 < *(uint *)((long)local_a8 + uVar10 * 4)));
          local_b0 = (undefined1  [8])uVar10;
        }
        test_counter = test_counter + 1;
        if (uVar10 < uVar14) {
          local_1e8._0_8_ = &local_1d8;
          std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                    ((wstring *)local_1e8,uVar2,local_1e8._8_8_);
          uVar2 = local_1e8._0_8_;
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)
              local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length) {
            if ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._8_8_ ==
                (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
              bVar15 = true;
            }
            else {
              iVar6 = wmemcmp((wchar_t *)local_1e8._0_8_,
                              local_148.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p,
                              local_1e8._8_8_);
              bVar15 = iVar6 == 0;
            }
          }
          else {
            bVar15 = false;
          }
          if ((mapping<std::_List_iterator<wchar_t>_> *)uVar2 != &local_1d8) {
            operator_delete((void *)uVar2);
          }
          if (!bVar15) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," p->str()==chunks[chunk_ptr]",0x1c);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar6 = error_counter + 1;
            bVar15 = 100000 < error_counter;
            error_counter = iVar6;
            if (bVar15) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1e8._0_8_ = &local_1d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar9,(string *)local_1e8);
              __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
          test_counter = test_counter + 1;
          if (uVar3 != *(wchar_t *)((long)local_e8 + uVar10 * 4)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," p->rule()==unsigned(masks[chunk_ptr])",0x26);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar6 = error_counter + 1;
            bVar15 = 100000 < error_counter;
            error_counter = iVar6;
            if (bVar15) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1e8._0_8_ = &local_1d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar9,(string *)local_1e8);
              __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
        }
        else if (((undefined1 *)CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_)
                  != local_1b0) ||
                (local_1d8.begin_._M_node !=
                 (_List_node_base *)
                 ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi
                  - (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                             *)local_1b0)->
                          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr >> 4))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xaf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p==map.end()",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1e8._0_8_ = &local_1d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1e8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1e8);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        _Var13._M_node = (_Var13._M_node)->_M_next;
        uVar12 = uVar12 + 1;
      } while (_Var13._M_node != local_158._M_node);
    }
    local_18c = 1;
    if (local_150._M_node != local_158._M_node) {
      uVar12 = 0;
      uVar14 = 0;
      _Var13._M_node = local_150._M_node;
      do {
        local_1e8._0_8_ = (mapping<std::_List_iterator<wchar_t>_> *)0x0;
        local_1e8._8_8_ = (mapping<std::_List_iterator<wchar_t>_> *)0x0;
        local_1d8.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1d8.begin_._M_node = (_List_node_base *)0x0;
        local_1d8.end_._M_node._0_5_ = SUB85(local_1b0,0);
        local_1d8.end_._M_node._5_3_ = (undefined3)((ulong)local_1b0 >> 0x28);
        local_1b8 = local_190;
        local_1b4 = (bool)local_18c;
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        set((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8,
            (base_iterator)_Var13._M_node);
        uVar3 = local_1d8.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr._0_4_;
        uVar2 = local_1e8._0_8_;
        uVar10 = (long)iStack_a0._M_current - (long)local_a8 >> 2;
        if (uVar14 < uVar10) {
          uVar14 = (ulong)(((int)uVar14 + 1) -
                          (uint)(uVar12 < *(uint *)((long)local_a8 + uVar14 * 4)));
        }
        test_counter = test_counter + 1;
        if (uVar14 < uVar10) {
          local_1e8._0_8_ = &local_1d8;
          std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                    ((wstring *)local_1e8,uVar2,local_1e8._8_8_);
          uVar2 = local_1e8._0_8_;
          local_b0._0_4_ = uVar3;
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)
              local_88.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
            if ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._8_8_ ==
                (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
              bVar15 = true;
            }
            else {
              iVar6 = wmemcmp((wchar_t *)local_1e8._0_8_,
                              local_88.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                              local_1e8._8_8_);
              bVar15 = iVar6 == 0;
            }
          }
          else {
            bVar15 = false;
          }
          if ((mapping<std::_List_iterator<wchar_t>_> *)uVar2 != &local_1d8) {
            operator_delete((void *)uVar2);
          }
          uVar3 = local_b0._0_4_;
          if (!bVar15) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," p->str()==fchunks[chunk_ptr]",0x1d);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar6 = error_counter + 1;
            bVar15 = 100000 < error_counter;
            error_counter = iVar6;
            if (bVar15) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1e8._0_8_ = &local_1d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar9,(string *)local_1e8);
              __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
          test_counter = test_counter + 1;
          if (uVar3 != *(int *)((long)local_e8 + uVar14 * 4)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," p->rule()==unsigned(masks[chunk_ptr])",0x26);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            iVar6 = error_counter + 1;
            bVar15 = 100000 < error_counter;
            error_counter = iVar6;
            if (bVar15) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1e8._0_8_ = &local_1d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar9,(string *)local_1e8);
              __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
        }
        else if (((undefined1 *)CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_)
                  != local_1b0) ||
                (local_1d8.begin_._M_node !=
                 (_List_node_base *)
                 ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi
                  - (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                             *)local_1b0)->
                          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr >> 4))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p==map.end()",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1e8._0_8_ = &local_1d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1e8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1e8);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        _Var13._M_node = (_Var13._M_node)->_M_next;
        uVar12 = uVar12 + 1;
      } while (_Var13._M_node != local_158._M_node);
    }
    if ((mapping<std::_List_iterator<wchar_t>_> *)_Stack_1a8._M_pi !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a8._M_pi);
    }
    booster::locale::boundary::details::mapping<std::_List_iterator<wchar_t>_>::mapping
              ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8,bt,
               (base_iterator)local_150._M_node,local_158,local_f0);
    local_1d8.begin_._M_node._0_4_ = local_184;
    local_228._0_8_ =
         CONCAT44(local_1d8.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr._4_4_,
                  local_1d8.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr._0_4_);
    local_228._8_8_ = local_228._8_8_ & 0xffffffff00000000;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_218.begin_._M_node._0_4_ = local_184;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 8))->_M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
           *)local_1e8._0_8_)->
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._0_8_ !=
            *(mapping<std::_List_iterator<wchar_t>_> **)((long)local_108 + (ulong)uVar12 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1b0 = (undefined1  [8])&local_1a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1b0);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_228._8_4_ !=
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1b0 = (undefined1  [8])&local_1a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1b0);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::increment
                  ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
        uVar12 = uVar12 + 1;
      } while (((mapping<std::_List_iterator<wchar_t>_> *)
                local_218.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (mapping<std::_List_iterator<wchar_t>_> *)local_1e8) ||
              ((mapping<std::_List_iterator<wchar_t>_> *)
               local_218.index_.
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr !=
               (mapping<std::_List_iterator<wchar_t>_> *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_1e8._0_8_)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)iStack_100._M_current - (long)local_108 >> 3 != (ulong)uVar12) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xda);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," iters.size() == i",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar15 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar15) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1b0 = (undefined1  [8])&local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_1b0);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    uVar12 = uVar12 - 1;
    do {
      booster::locale::boundary::details::
      boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::decrement
                ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
      test_counter = test_counter + 1;
      if ((ulong)((long)iStack_100._M_current - (long)local_108 >> 3) <= (ulong)uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0011c624:
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1b0 = (undefined1  [8])&local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_1b0);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
      if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._0_8_ !=
          *(mapping<std::_List_iterator<wchar_t>_> **)((long)local_108 + (ulong)uVar12 * 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," p->iterator()==iters.at(i)",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar6 = error_counter + 1;
        bVar15 = 100000 < error_counter;
        error_counter = iVar6;
        if (bVar15) goto LAB_0011c624;
      }
      uVar12 = uVar12 - 1;
    } while (((mapping<std::_List_iterator<wchar_t>_> *)
              local_218.index_.
              super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (mapping<std::_List_iterator<wchar_t>_> *)local_1e8) ||
            ((mapping<std::_List_iterator<wchar_t>_> *)
             local_218.index_.
             super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr != (mapping<std::_List_iterator<wchar_t>_> *)0x0));
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar6 = error_counter + 1;
      bVar15 = 100000 < error_counter;
      error_counter = iVar6;
      if (bVar15) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1b0 = (undefined1  [8])&local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b0,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_1b0);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    if (local_150._M_node != local_158._M_node) {
      uVar14 = 0;
      _Var13._M_node = local_150._M_node;
      do {
        local_1b0 = (undefined1  [8])0x0;
        _Stack_1a8._M_pi = _Stack_1a8._M_pi & 0xffffffff00000000;
        local_1a0._8_8_ = local_1e8;
        local_190 = (uint)local_1d8.begin_._M_node;
        booster::locale::boundary::details::
        boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::set
                  ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)local_1b0,
                   (base_iterator)_Var13._M_node);
        local_218.begin_._M_node._0_4_ = local_190;
        local_218.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_1a0._M_allocated_capacity;
        local_218.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_;
        local_228._0_8_ = local_1b0;
        local_228._8_8_ = _Stack_1a8._M_pi;
        test_counter = test_counter + 1;
        if (local_1b0 !=
            (undefined1  [8])
            *(mapping<std::_List_iterator<wchar_t>_> **)((long)local_108 + uVar14 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->iterator()==iters[iters_ptr]",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1b0 = (undefined1  [8])&local_1a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1b0);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        if ((ulong)((long)iStack_100._M_current - (long)local_108 >> 3) <= uVar14) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar14);
LAB_0011c692:
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_228._0_8_ = _Var13._M_node;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar9,(string *)local_228);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
        uVar14 = (ulong)((int)uVar14 +
                        (uint)(*(_List_node_base **)((long)local_108 + uVar14 * 8) == _Var13._M_node
                              ));
        _Var13._M_node = (_Var13._M_node)->_M_next;
      } while (_Var13._M_node != local_158._M_node);
    }
    if ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._8_8_ !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
    }
    booster::locale::boundary::details::mapping<std::_List_iterator<wchar_t>_>::mapping
              ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8,bt,
               (base_iterator)local_150._M_node,local_158,local_f0);
    local_1d8.begin_._M_node =
         (_List_node_base *)
         (CONCAT44((int)((ulong)local_1d8.begin_._M_node >> 0x20),local_184) & 0xffffff00ffffffff);
    local_228._0_8_ = local_1e8._0_8_;
    local_228._8_8_ = local_1e8._8_8_;
    if ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._8_8_ !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._8_8_ + 8))->_M_pi +
             1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._8_8_ + 8))->_M_pi +
             1;
      }
    }
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT44(local_1d8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_,
                       local_1d8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._0_4_);
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_1d8.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_218.begin_._M_node._0_4_ = local_184;
    _Stack_1a8._M_pi = _Stack_1a8._M_pi & 0xffffffff00000000;
    local_1a0._M_allocated_capacity = 0;
    local_190 = local_184;
    local_1b0 = (undefined1  [8])
                local_218.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_1a0._8_8_ = (_List_node_base *)local_228;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._0_8_ + 8))->_M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
           *)local_1e8._0_8_)->
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr) {
      uVar14 = 0;
      local_1a0._8_8_ = (_List_node_base *)local_228;
      do {
        test_counter = test_counter + 1;
        if (local_1b0 != (undefined1  [8])*(_List_node_base **)((long)local_108 + uVar14 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_180 = (undefined1  [8])&aStack_170;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_180,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_180);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)_Stack_1a8._M_pi !=
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xfa);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_180 = (undefined1  [8])&aStack_170;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_180,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_180);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::increment
                  ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)local_1b0);
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (((_List_node_base *)local_1a0._8_8_ != (_List_node_base *)local_228) ||
              ((_List_node_base *)local_1a0._M_allocated_capacity !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228._0_8_ + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_228._0_8_)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
    }
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_218.begin_._M_node._0_4_ = local_184;
    local_228._0_8_ = local_1e8._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8),
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT44(local_1d8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_,
                       local_1d8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._0_4_);
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_1d8.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    _Stack_1a8._M_pi = _Stack_1a8._M_pi & 0xffffffff00000000;
    local_1a0._M_allocated_capacity = 0;
    local_190 = (uint)local_218.begin_._M_node;
    local_1b0 = (undefined1  [8])
                local_218.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_1a0._8_8_ = (_List_node_base *)local_228;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228._0_8_ + 8))->_M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
           *)local_228._0_8_)->
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr) {
      uVar14 = 0;
      local_1a0._8_8_ = (_List_node_base *)local_228;
      do {
        test_counter = test_counter + 1;
        if (local_1b0 !=
            (undefined1  [8])
            *(mapping<std::_List_iterator<wchar_t>_> **)((long)local_108 + uVar14 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x104);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_180 = (undefined1  [8])&aStack_170;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_180,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_180);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)_Stack_1a8._M_pi !=
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x105);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_180 = (undefined1  [8])&aStack_170;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_180,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_180);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::increment
                  ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)local_1b0);
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (((_List_node_base *)local_1a0._8_8_ != (_List_node_base *)local_228) ||
              ((_List_node_base *)local_1a0._M_allocated_capacity !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228._0_8_ + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_228._0_8_)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
    }
    booster::locale::boundary::details::mapping<std::_List_iterator<wchar_t>_>::mapping
              ((mapping<std::_List_iterator<wchar_t>_> *)local_228,bt,
               (base_iterator)local_150._M_node,local_158,local_f0);
    local_218.begin_._M_node._0_4_ = local_184;
    local_1b0 = (undefined1  [8])local_228._0_8_;
    _Stack_1a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_228._8_8_ + 8) = *(int *)(local_228._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_228._8_8_ + 8) = *(int *)(local_228._8_8_ + 8) + 1;
      }
    }
    local_1a0._M_allocated_capacity =
         (size_type)
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1a0._8_8_ =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_190 = local_184;
    local_180 = (undefined1  [8])
                local_218.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_178._M_pi = local_178._M_pi & 0xffffffff00000000;
    aStack_170._M_allocated_capacity = 0;
    aStack_170._8_8_ = local_1b0;
    local_160 = local_184;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228._0_8_ + 8))->_M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
           *)local_228._0_8_)->
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr) {
      uVar14 = 0;
      do {
        test_counter = test_counter + 1;
        if (local_180 !=
            (undefined1  [8])
            *(mapping<std::_List_iterator<wchar_t>_> **)((long)local_108 + uVar14 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x110);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_130,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,&local_130);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)local_178._M_pi !=
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar14]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x111);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_130,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,&local_130);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::increment
                  ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)local_180);
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (((mapping_type *)aStack_170._8_8_ != (mapping_type *)local_1b0) ||
              ((_List_node_base *)aStack_170._M_allocated_capacity !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_1b0)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    if (_Stack_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a8._M_pi);
    }
    local_1a0._8_8_ = (_List_node_base *)0x0;
    _Stack_1a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a0._M_allocated_capacity = 0;
    local_190 = 0xffffffff;
    local_1b0 = (undefined1  [8])local_228._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_1a8,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_228 + 8));
    local_1a0._M_allocated_capacity =
         (size_type)
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1a0._8_8_ =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_190 = (uint)local_218.begin_._M_node;
    local_180 = (undefined1  [8])
                local_218.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_178._M_pi = local_178._M_pi & 0xffffffff00000000;
    aStack_170._M_allocated_capacity = 0;
    aStack_170._8_8_ = local_1b0;
    local_160 = (uint)local_218.begin_._M_node;
    if (((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
           *)local_1b0)->
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr) {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        if (local_180 !=
            (undefined1  [8])
            *(mapping<std::_List_iterator<wchar_t>_> **)((long)local_108 + (ulong)uVar12 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_130,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,&local_130);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)local_178._M_pi !=
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar6 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar6;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_130,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,&local_130);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::increment
                  ((boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *)local_180);
        uVar12 = uVar12 + 1;
      } while (((mapping_type *)aStack_170._8_8_ != (mapping_type *)local_1b0) ||
              ((_List_node_base *)aStack_170._M_allocated_capacity !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b0 + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_1b0)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    if ((mapping<std::_List_iterator<wchar_t>_> *)_Stack_1a8._M_pi !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a8._M_pi);
    }
    iVar6 = (int)local_d0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
    }
    if ((mapping<std::_List_iterator<wchar_t>_> *)local_1e8._8_8_ !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
    }
    booster::locale::boundary::details::mapping<std::_List_iterator<wchar_t>_>::mapping
              ((mapping<std::_List_iterator<wchar_t>_> *)local_1b0,bt,
               (base_iterator)local_150._M_node,local_158,local_f0);
    local_190 = 0xffffffff;
    local_180 = local_1b0;
    local_178._M_pi = _Stack_1a8._M_pi;
    if ((mapping<std::_List_iterator<wchar_t>_> *)_Stack_1a8._M_pi !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1a8._M_pi)->_M_use_count)->
                 _M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(_Stack_1a8._M_pi)->_M_use_count)->_M_pi + 1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1a8._M_pi)->_M_use_count)->
                 _M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(_Stack_1a8._M_pi)->_M_use_count)->_M_pi + 1;
      }
    }
    aStack_170._M_allocated_capacity = local_1a0._M_allocated_capacity;
    aStack_170._8_8_ = local_1a0._8_8_;
    local_15c = 0;
    local_160 = local_184;
    local_1e8._0_8_ = (_List_node_base *)0x0;
    local_1e8._8_8_ = (_List_node_base *)0x0;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d8.begin_._M_node = (_List_node_base *)0x0;
    local_1d8.end_._M_node._0_5_ = 0;
    local_1d8.end_._M_node._5_3_ = 0;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.begin_._M_node = (_List_node_base *)0x0;
    local_218.end_._M_node._0_5_ = SUB85(local_180,0);
    local_218.end_._M_node._5_3_ = (undefined3)((ulong)local_180 >> 0x28);
    local_1f8 = local_184;
    local_1f4 = false;
    local_228._0_8_ = local_1a0._M_allocated_capacity;
    local_228._8_8_ = local_1a0._M_allocated_capacity;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_218.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
    local_1e8._0_8_ = local_228._0_8_;
    local_1e8._8_8_ = local_228._8_8_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1d8.begin_._M_node = local_218.begin_._M_node;
    local_1b8 = local_1f8;
    local_1b4 = local_1f4;
    local_1d8.end_._M_node._0_5_ = local_218.end_._M_node._0_5_;
    local_1d8.end_._M_node._5_3_ = local_218.end_._M_node._5_3_;
    if (((undefined1 *)CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_) !=
         local_180) ||
       (local_218.begin_._M_node !=
        (_List_node_base *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_180 + 8))->_M_pi -
         (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                  *)local_180)->
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr >> 4))) {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        local_228._0_8_ = &local_218;
        std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                  ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
        uVar2 = local_228._0_8_;
        uVar14 = (ulong)uVar12;
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)
            local_148.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
            bVar15 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                            local_228._8_8_);
            bVar15 = iVar6 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((mapping<std::_List_iterator<wchar_t>_> *)uVar2 != &local_218) {
          operator_delete((void *)uVar2);
        }
        iVar6 = (int)local_d0;
        if (!bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x127);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar1 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = &local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1d8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x128);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar1 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = &local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
        uVar12 = uVar12 + 1;
      } while (((undefined1 *)CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) !=
                local_180) ||
              (local_1d8.begin_._M_node !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_180 + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_180)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    if ((mapping<std::_List_iterator<wchar_t>_> *)local_178._M_pi !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
    }
    aStack_170._8_8_ = (mapping_type *)0x0;
    local_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    aStack_170._M_allocated_capacity = 0;
    local_15c = 0;
    local_160 = local_184;
    local_180 = local_1b0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_178,&_Stack_1a8);
    aStack_170._M_allocated_capacity = local_1a0._M_allocated_capacity;
    aStack_170._8_8_ = local_1a0._8_8_;
    local_1e8._0_8_ = (_List_node_base *)0x0;
    local_1e8._8_8_ = (_List_node_base *)0x0;
    local_1d8.end_._M_node._0_5_ = 0;
    local_1d8.end_._M_node._5_3_ = 0;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d8.begin_._M_node = (_List_node_base *)0x0;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.begin_._M_node = (_List_node_base *)0x0;
    local_218.end_._M_node._0_5_ = SUB85(local_180,0);
    local_218.end_._M_node._5_3_ = (undefined3)((ulong)local_180 >> 0x28);
    local_1f8 = local_160;
    local_1f4 = (bool)local_15c;
    local_228._0_8_ = local_1a0._M_allocated_capacity;
    local_228._8_8_ = local_1a0._M_allocated_capacity;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_218.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
    local_1e8._0_8_ = local_228._0_8_;
    local_1e8._8_8_ = local_228._8_8_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1d8.begin_._M_node = local_218.begin_._M_node;
    local_1b8 = local_1f8;
    local_1b4 = local_1f4;
    local_1d8.end_._M_node._0_5_ = local_218.end_._M_node._0_5_;
    local_1d8.end_._M_node._5_3_ = local_218.end_._M_node._5_3_;
    if (((undefined1 *)CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_) !=
         local_180) ||
       (local_218.begin_._M_node !=
        (_List_node_base *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_180 + 8))->_M_pi -
         (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                  *)local_180)->
               super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr >> 4))) {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        local_228._0_8_ = &local_218;
        std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                  ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
        uVar2 = local_228._0_8_;
        uVar14 = (ulong)uVar12;
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)
            local_148.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
            bVar15 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                            local_228._8_8_);
            bVar15 = iVar6 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((mapping<std::_List_iterator<wchar_t>_> *)uVar2 != &local_218) {
          operator_delete((void *)uVar2);
        }
        iVar6 = (int)local_d0;
        if (!bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x132);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar1 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = &local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1d8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x133);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar1 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = &local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
        uVar12 = uVar12 + 1;
      } while (((undefined1 *)CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) !=
                local_180) ||
              (local_1d8.begin_._M_node !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_180 + 8))->_M_pi -
                (long)(((shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>_>
                         *)local_180)->
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr >> 4)));
    }
    if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
    }
    booster::locale::boundary::details::mapping<std::_List_iterator<wchar_t>_>::mapping
              ((mapping<std::_List_iterator<wchar_t>_> *)local_180,bt,
               (base_iterator)local_150._M_node,local_158,local_f0);
    local_15c = 0;
    local_160 = local_184;
    local_130._M_dataplus._M_p = (pointer)local_180;
    local_130._M_string_length = (size_type)local_178._M_pi;
    if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
      }
    }
    local_130.field_2._M_allocated_capacity = aStack_170._M_allocated_capacity;
    local_130.field_2._8_8_ = aStack_170._8_8_;
    local_10c = 0;
    local_110 = local_184;
    local_1e8._0_8_ = (_List_node_base *)0x0;
    local_1e8._8_8_ = (_List_node_base *)0x0;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d8.begin_._M_node = (_List_node_base *)0x0;
    local_1d8.end_._M_node._0_5_ = 0;
    local_1d8.end_._M_node._5_3_ = 0;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.begin_._M_node = (_List_node_base *)0x0;
    local_218.end_._M_node._0_5_ = SUB85(&local_130,0);
    local_218.end_._M_node._5_3_ = (undefined3)((ulong)&local_130 >> 0x28);
    local_1f8 = local_184;
    local_1f4 = false;
    local_228._0_8_ = aStack_170._M_allocated_capacity;
    local_228._8_8_ = aStack_170._M_allocated_capacity;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_218.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
    local_1e8._0_8_ = local_228._0_8_;
    local_1e8._8_8_ = local_228._8_8_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1d8.begin_._M_node = local_218.begin_._M_node;
    local_1b8 = local_1f8;
    local_1b4 = local_1f4;
    local_1d8.end_._M_node._0_5_ = local_218.end_._M_node._0_5_;
    local_1d8.end_._M_node._5_3_ = local_218.end_._M_node._5_3_;
    if (((string *)CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_) != &local_130
        ) || (local_218.begin_._M_node !=
              (_List_node_base *)
              ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_130._M_dataplus._M_p + 8)
                     )->_M_pi - *(long *)local_130._M_dataplus._M_p >> 4))) {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        local_228._0_8_ = &local_218;
        std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                  ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
        uVar2 = local_228._0_8_;
        uVar14 = (ulong)uVar12;
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)
            local_148.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
            bVar15 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                            local_228._8_8_);
            bVar15 = iVar6 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((mapping<std::_List_iterator<wchar_t>_> *)uVar2 != &local_218) {
          operator_delete((void *)uVar2);
        }
        iVar6 = (int)local_d0;
        if (!bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar1 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = &local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1d8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar1 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = &local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
        uVar12 = uVar12 + 1;
      } while (((string *)CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) !=
                &local_130) ||
              (local_1d8.begin_._M_node !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      (local_130._M_dataplus._M_p + 8))->_M_pi - *(long *)local_130._M_dataplus._M_p
               >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length);
    }
    local_130.field_2._8_8_ = 0;
    local_130._M_string_length = 0;
    local_130.field_2._M_allocated_capacity = 0;
    local_110 = 0xffffffff;
    local_10c = 0;
    local_130._M_dataplus._M_p = (pointer)local_180;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length,&local_178)
    ;
    local_130.field_2._M_allocated_capacity = aStack_170._M_allocated_capacity;
    local_130.field_2._8_8_ = aStack_170._8_8_;
    local_110 = local_160;
    local_10c = local_15c;
    local_1e8._0_8_ = (_List_node_base *)0x0;
    local_1e8._8_8_ = (_List_node_base *)0x0;
    local_1d8.end_._M_node._0_5_ = 0;
    local_1d8.end_._M_node._5_3_ = 0;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d8.begin_._M_node = (_List_node_base *)0x0;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_218.begin_._M_node = (_List_node_base *)0x0;
    local_218.end_._M_node._0_5_ = SUB85(&local_130,0);
    local_218.end_._M_node._5_3_ = (undefined3)((ulong)&local_130 >> 0x28);
    local_1f8 = local_160;
    local_1f4 = (bool)local_15c;
    local_228._0_8_ = aStack_170._M_allocated_capacity;
    local_228._8_8_ = aStack_170._M_allocated_capacity;
    local_218.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_218.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
    increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_228);
    local_1e8._0_8_ = local_228._0_8_;
    local_1e8._8_8_ = local_228._8_8_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1d8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_218.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1d8.begin_._M_node = local_218.begin_._M_node;
    local_1b8 = local_1f8;
    local_1b4 = local_1f4;
    local_1d8.end_._M_node._0_5_ = local_218.end_._M_node._0_5_;
    local_1d8.end_._M_node._5_3_ = local_218.end_._M_node._5_3_;
    if (((string *)CONCAT35(local_218.end_._M_node._5_3_,local_218.end_._M_node._0_5_) != &local_130
        ) || (local_218.begin_._M_node !=
              (_List_node_base *)
              ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_130._M_dataplus._M_p + 8)
                     )->_M_pi - *(long *)local_130._M_dataplus._M_p >> 4))) {
      uVar14 = 0;
      do {
        test_counter = test_counter + 1;
        local_228._0_8_ = &local_218;
        std::__cxx11::wstring::_M_construct<std::_List_iterator<wchar_t>>
                  ((wstring *)local_228,local_1e8._0_8_,local_1e8._8_8_);
        uVar2 = local_228._0_8_;
        if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
            (mapping<std::_List_iterator<wchar_t>_> *)
            local_148.
            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length) {
          if ((mapping<std::_List_iterator<wchar_t>_> *)local_228._8_8_ ==
              (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
            bVar15 = true;
          }
          else {
            iVar6 = wmemcmp((wchar_t *)local_228._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p,
                            local_228._8_8_);
            bVar15 = iVar6 == 0;
          }
        }
        else {
          bVar15 = false;
        }
        if ((mapping<std::_List_iterator<wchar_t>_> *)uVar2 != &local_218) {
          operator_delete((void *)uVar2);
        }
        iVar6 = (int)local_d0;
        if (!bVar15) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x147);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar1 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = &local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1d8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_e8 + uVar14 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x148);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          iVar1 = error_counter + 1;
          bVar15 = 100000 < error_counter;
          error_counter = iVar1;
          if (bVar15) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_228._0_8_ = &local_218;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_228,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_228);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::segment_index_iterator<std::_List_iterator<wchar_t>_>::
        increment((segment_index_iterator<std::_List_iterator<wchar_t>_> *)local_1e8);
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (((string *)CONCAT35(local_1d8.end_._M_node._5_3_,local_1d8.end_._M_node._0_5_) !=
                &local_130) ||
              (local_1d8.begin_._M_node !=
               (_List_node_base *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      (local_130._M_dataplus._M_p + 8))->_M_pi - *(long *)local_130._M_dataplus._M_p
               >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length);
    }
    ichunks = local_38;
    imasks = local_40;
    if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
    }
    if ((mapping<std::_List_iterator<wchar_t>_> *)_Stack_1a8._M_pi !=
        (mapping<std::_List_iterator<wchar_t>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a8._M_pi);
    }
    if (local_108 != (void *)0x0) {
      operator_delete(local_108);
    }
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector(&local_88);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a8 != (void *)0x0) {
      operator_delete(local_a8);
    }
    if (local_e8 != (void *)0x0) {
      operator_delete(local_e8);
    }
    uVar14 = (ulong)(iVar6 - 1);
    if (iVar6 < 1) {
      return;
    }
  } while( true );
}

Assistant:

void test_word_container(Iterator begin,Iterator end,
    std::vector<int> const &ipos,
    std::vector<int> const &imasks,
    std::vector<std::basic_string<Char> > const &ichunks,
    std::locale l,
    lb::boundary_type bt=lb::word
    )
{
    for(int sm=(bt == lb::word ? 31 : 3 ) ;sm>=0;sm--) {
        unsigned mask = 
              ((sm & 1 ) != 0) * 0xF
            + ((sm & 2 ) != 0) * 0xF0
            + ((sm & 4 ) != 0) * 0xF00
            + ((sm & 8 ) != 0) * 0xF000
            + ((sm & 16) != 0) * 0xF0000;

        std::vector<int> masks,pos;
        std::vector<unsigned> bmasks;
        std::basic_string<Char> empty_chunk;

        std::vector<std::basic_string<Char> > chunks;
        std::vector<std::basic_string<Char> > fchunks;
        std::vector<Iterator> iters;
        iters.push_back(begin);
        bmasks.push_back(0);

        for(unsigned i=0;i<imasks.size();i++) {
            if(imasks[i] & mask) {
                masks.push_back(imasks[i]);
                chunks.push_back(ichunks[i]);
                fchunks.push_back(empty_chunk + ichunks[i]);
                empty_chunk.clear();
                pos.push_back(ipos[i]);
            }
            else {
                empty_chunk+=ichunks[i];
            }

            if((imasks[i] & mask) || i==imasks.size()-1){
                Iterator ptr=begin;
                std::advance(ptr,ipos[i]);
                iters.push_back(ptr);
                bmasks.push_back(imasks[i]);
            }
        }

        //
        // segment iterator tests
        //
        {
            lb::segment_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::segment_index<Iterator>::iterator iter_type;

            map.rule(mask);

            {        
                unsigned i=0;
                iter_type p;
                map.full_select(false);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==chunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }
                
                TEST(chunks.size() == i);
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        TEST(p->str()==chunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==chunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }

            {
                unsigned i=0;
                iter_type p;
                map.full_select(true);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==fchunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }

                TEST(chunks.size() == i);
                
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        if(p->str()!=fchunks[i-1]) {
                            print_str(p->str());
                            print_str(fchunks[i-1]);
                        }
                        TEST(p->str()==fchunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==fchunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }
            
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(false);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==chunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(true);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==fchunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }

        } // segment iterator tests

        { // break iterator tests
            lb::boundary_point_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::boundary_point_index<Iterator>::iterator iter_type;

            map.rule(mask);
        
            unsigned i=0;
            iter_type p;
            for(p=map.begin();p!=map.end();++p,i++) {
                TEST(p->iterator()==iters[i]);
                TEST(p->rule()==bmasks[i]);
            }

            TEST(iters.size() == i);

            do {
                --p;
                --i;
                TEST(p->iterator()==iters.at(i));
            } while(p!=map.begin());
            TEST(i==0);

            unsigned iters_ptr=0;
            for(Iterator optr=begin;optr!=end;optr++) {
                p=map.find(optr);
                TEST(p->iterator()==iters[iters_ptr]);
                if(iters.at(iters_ptr)==optr)
                    iters_ptr++;
            }
        
        } // break iterator tests

        { // copy test
            typedef lb::segment_index<Iterator> ti_type;
            typedef lb::boundary_point_index<Iterator> bi_type;
            {   // segment to bound
                ti_type ti(bt,begin,end,l);
                ti.rule(mask);
                {
                    bi_type bi(ti);
                    bi.rule(mask);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi.rule(mask);
                    bi = ti;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                // boundary_point to bound
                bi_type bi_2(bt,begin,end,l);
                bi_2.rule(mask);
                {
                    bi_type bi(bi_2);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi = bi_2;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
            }
            {   // boundary_point to segment
                bi_type bi(bt,begin,end,l);
                {
                    ti_type ti(bi);
                    ti.rule(mask);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti.rule(mask);
                    ti = (bi);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                ti_type ti_2(bt,begin,end,l);
                ti_2.rule(mask);
                {
                    ti_type ti(ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti = (ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
            }
        }
    } // for mask

}